

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void whereInfoFree(sqlite3 *db,WhereInfo *pWInfo)

{
  sqlite3_index_info *p;
  Index *p_00;
  WhereLevel *pWVar1;
  long lVar2;
  
  pWVar1 = pWInfo->a;
  for (lVar2 = 0; lVar2 < pWInfo->nLevel; lVar2 = lVar2 + 1) {
    p = pWVar1->pIdxInfo;
    if (p != (sqlite3_index_info *)0x0) {
      if (p->needToFreeIdxStr != 0) {
        sqlite3_free(p->idxStr);
      }
      sqlite3DbFree(db,p);
    }
    if ((((pWVar1->plan).wsFlags & 0x20000000) != 0) &&
       (p_00 = (pWVar1->plan).u.pIdx, p_00 != (Index *)0x0)) {
      sqlite3DbFree(db,p_00->zColAff);
      sqlite3DbFree(db,p_00);
    }
    pWVar1 = pWVar1 + 1;
  }
  whereClauseClear(pWInfo->pWC);
  sqlite3DbFree(db,pWInfo);
  return;
}

Assistant:

static void whereInfoFree(sqlite3 *db, WhereInfo *pWInfo){
  if( ALWAYS(pWInfo) ){
    int i;
    for(i=0; i<pWInfo->nLevel; i++){
      sqlite3_index_info *pInfo = pWInfo->a[i].pIdxInfo;
      if( pInfo ){
        /* assert( pInfo->needToFreeIdxStr==0 || db->mallocFailed ); */
        if( pInfo->needToFreeIdxStr ){
          sqlite3_free(pInfo->idxStr);
        }
        sqlite3DbFree(db, pInfo);
      }
      if( pWInfo->a[i].plan.wsFlags & WHERE_TEMP_INDEX ){
        Index *pIdx = pWInfo->a[i].plan.u.pIdx;
        if( pIdx ){
          sqlite3DbFree(db, pIdx->zColAff);
          sqlite3DbFree(db, pIdx);
        }
      }
    }
    whereClauseClear(pWInfo->pWC);
    sqlite3DbFree(db, pWInfo);
  }
}